

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBitString.h
# Opt level: O2

void __thiscall jbcoin::STBitString<256UL>::add(STBitString<256UL> *this,Serializer *s)

{
  SField *pSVar1;
  uint __line;
  char *__assertion;
  
  pSVar1 = (this->super_STBase).fName;
  if (pSVar1->fieldValue < 0x100) {
    if (pSVar1->fieldType == STI_HASH256) {
      Serializer::addBitString<256,void>(s,&this->value_);
      return;
    }
    __assertion = "fName->fieldType == getSType()";
    __line = 0x61;
  }
  else {
    __assertion = "fName->isBinary ()";
    __line = 0x60;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/STBitString.h"
                ,__line,"virtual void jbcoin::STBitString<256>::add(Serializer &) const");
}

Assistant:

void
    add (Serializer& s) const override
    {
        assert (fName->isBinary ());
        assert (fName->fieldType == getSType());
        s.addBitString<Bits> (value_);
    }